

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::SetCompilerFlags
          (cmGhsMultiTargetGenerator *this,string *config,string *language)

{
  cmLocalGhsMultiGenerator *pcVar1;
  bool bVar2;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var3;
  undefined1 local_e0 [8];
  value_type entry;
  string local_80;
  undefined1 local_50 [8];
  string flags;
  _Self local_28;
  iterator i;
  string *language_local;
  string *config_local;
  cmGhsMultiTargetGenerator *this_local;
  
  i._M_node = (_Base_ptr)language;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->FlagsByLanguage,language);
  flags.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->FlagsByLanguage);
  bVar2 = std::operator==(&local_28,(_Self *)((long)&flags.field_2 + 8));
  if (bVar2) {
    std::__cxx11::string::string((string *)local_50);
    cmLocalGenerator::AddLanguageFlags
              (&this->LocalGenerator->super_cmLocalGenerator,(string *)local_50,
               this->GeneratorTarget,Compile,(string *)i._M_node,config);
    cmLocalGenerator::AddCMP0018Flags
              (&this->LocalGenerator->super_cmLocalGenerator,(string *)local_50,
               this->GeneratorTarget,(string *)i._M_node,config);
    cmLocalGenerator::AddVisibilityPresetFlags
              (&this->LocalGenerator->super_cmLocalGenerator,(string *)local_50,
               this->GeneratorTarget,(string *)i._M_node);
    cmLocalGenerator::AddColorDiagnosticsFlags
              (&this->LocalGenerator->super_cmLocalGenerator,(string *)local_50,(string *)i._M_node)
    ;
    cmMakefile::GetDefineFlags_abi_cxx11_(&local_80,this->Makefile);
    bVar2 = std::operator!=(&local_80," ");
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar2) {
      pcVar1 = this->LocalGenerator;
      cmMakefile::GetDefineFlags_abi_cxx11_
                ((string *)((long)&entry.second.field_2 + 8),this->Makefile);
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (pcVar1,local_50,(undefined1 *)((long)&entry.second.field_2 + 8));
      std::__cxx11::string::~string((string *)(entry.second.field_2._M_local_buf + 8));
    }
    cmLocalGenerator::AddCompileOptions
              (&this->LocalGenerator->super_cmLocalGenerator,(string *)local_50,
               this->GeneratorTarget,(string *)i._M_node,config);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i._M_node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    _Var3 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->FlagsByLanguage,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_e0);
    local_28._M_node = (_Base_ptr)_Var3.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_e0);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::SetCompilerFlags(std::string const& config,
                                                 const std::string& language)
{
  auto i = this->FlagsByLanguage.find(language);
  if (i == this->FlagsByLanguage.end()) {
    std::string flags;
    this->LocalGenerator->AddLanguageFlags(
      flags, this->GeneratorTarget, cmBuildStep::Compile, language, config);
    this->LocalGenerator->AddCMP0018Flags(flags, this->GeneratorTarget,
                                          language, config);
    this->LocalGenerator->AddVisibilityPresetFlags(
      flags, this->GeneratorTarget, language);
    this->LocalGenerator->AddColorDiagnosticsFlags(flags, language);

    // Append old-style preprocessor definition flags.
    if (this->Makefile->GetDefineFlags() != " ") {
      this->LocalGenerator->AppendFlags(flags,
                                        this->Makefile->GetDefineFlags());
    }

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->GeneratorTarget,
                                            language, config);

    std::map<std::string, std::string>::value_type entry(language, flags);
    i = this->FlagsByLanguage.insert(entry).first;
  }
}